

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O3

test_suite * init_unit_test_suite(int argc,char **argv)

{
  char *pcVar1;
  function_buffer *pfVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  test_suite *this;
  test_case *ptVar4;
  const_string *name;
  const_string *name_00;
  const_string *name_01;
  const_string *name_02;
  const_string *name_03;
  const_string *name_04;
  const_string *name_05;
  char *pcVar5;
  undefined1 local_118 [32];
  const_string local_f8;
  const_string local_e8;
  param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*> local_d8;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  this = (test_suite *)operator_new(0x180);
  local_50.m_begin = "Avro C++ unit tests for json routines";
  local_50.m_end = "";
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  do {
    pcVar5 = local_40.m_end + 1;
    local_40.m_end = local_40.m_end + 1;
  } while (*pcVar5 != '\0');
  boost::unit_test::test_suite::test_suite(this,&local_50,&local_40,0xbc);
  local_118._8_8_ = avro::json::testNull;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  local_60.m_end = "";
  do {
    pcVar5 = local_60.m_end + 1;
    local_60.m_end = local_60.m_end + 1;
  } while (*pcVar5 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testNull";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xbe,(function<void_()> *)local_118);
  pfVar2 = &local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
            super_function_base.functor;
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_f8.m_end = "";
  do {
    pcVar5 = local_f8.m_end + 1;
    local_f8.m_end = local_f8.m_end + 1;
  } while (*pcVar5 != '\0');
  local_118._8_8_ = avro::json::testBool;
  local_118._0_8_ =
       boost::function1<void,avro::json::TestData<bool>>::
       assign_to<void(*)(avro::json::TestData<bool>const&)>(void(*)(avro::json::TestData<bool>const&))
       ::stored_vtable + 1;
  local_e8.m_begin = "&avro::json::testBool";
  local_e8.m_end = "";
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<bool>,_avro::json::TestData<bool>_*>::
  param_test_case_generator
            (&local_d8,(function<void_(avro::json::TestData<bool>)> *)local_118,&local_e8,&local_f8,
             0xc1,(TestData<bool> *)avro::json::boolData,(TestData<bool> *)avro::json::longData);
  boost::function1<void,_avro::json::TestData<bool>_>::~function1
            ((function1<void,_avro::json::TestData<bool>_> *)local_118);
  boost::unit_test::test_suite::add(this,&local_d8.super_test_unit_generator,0);
  paVar3 = &local_d8.m_tc_name.field_2;
  local_d8.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001becb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_tc_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8.m_tc_name._M_dataplus._M_p,
                    local_d8.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::json::TestData<bool>_>::~function1
            (&local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>);
  local_f8.m_end = "";
  do {
    pcVar5 = local_f8.m_end + 1;
    local_f8.m_end = local_f8.m_end + 1;
  } while (*pcVar5 != '\0');
  local_118._8_8_ = avro::json::testLong;
  local_118._0_8_ =
       boost::function1<void,avro::json::TestData<long>>::
       assign_to<void(*)(avro::json::TestData<long>const&)>(void(*)(avro::json::TestData<long>const&))
       ::stored_vtable + 1;
  local_e8.m_begin = "&avro::json::testLong";
  local_e8.m_end = "";
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<long>,_avro::json::TestData<long>_*> *)
             &local_d8,(function<void_(avro::json::TestData<long>)> *)local_118,&local_e8,&local_f8,
             0xc4,(TestData<long> *)avro::json::longData,(TestData<long> *)&DAT_001c0588);
  boost::function1<void,_avro::json::TestData<long>_>::~function1
            ((function1<void,_avro::json::TestData<long>_> *)local_118);
  boost::unit_test::test_suite::add(this,&local_d8.super_test_unit_generator,0);
  local_d8.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001bed20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_tc_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8.m_tc_name._M_dataplus._M_p,
                    local_d8.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::json::TestData<long>_>::~function1
            ((function1<void,_avro::json::TestData<long>_> *)&local_d8.m_test_func);
  local_f8.m_end = "";
  do {
    pcVar5 = local_f8.m_end + 1;
    local_f8.m_end = local_f8.m_end + 1;
  } while (*pcVar5 != '\0');
  local_118._8_8_ = avro::json::testDouble;
  local_118._0_8_ =
       boost::function1<void,avro::json::TestData<double>>::
       assign_to<void(*)(avro::json::TestData<double>const&)>(void(*)(avro::json::TestData<double>const&))
       ::stored_vtable + 1;
  local_e8.m_begin = "&avro::json::testDouble";
  local_e8.m_end = "";
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>::
  param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<double>,_avro::json::TestData<double>_*>
              *)&local_d8,(function<void_(avro::json::TestData<double>)> *)local_118,&local_e8,
             &local_f8,199,(TestData<double> *)avro::json::doubleData,
             (TestData<double> *)&DAT_001c0608);
  boost::function1<void,_avro::json::TestData<double>_>::~function1
            ((function1<void,_avro::json::TestData<double>_> *)local_118);
  boost::unit_test::test_suite::add(this,&local_d8.super_test_unit_generator,0);
  local_d8.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001bed80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_tc_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8.m_tc_name._M_dataplus._M_p,
                    local_d8.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::json::TestData<double>_>::~function1
            ((function1<void,_avro::json::TestData<double>_> *)&local_d8.m_test_func);
  local_f8.m_end = "";
  do {
    pcVar5 = local_f8.m_end + 1;
    local_f8.m_end = local_f8.m_end + 1;
  } while (*pcVar5 != '\0');
  local_118._8_8_ = avro::json::testString;
  local_118._0_8_ =
       boost::function1<void,avro::json::TestData<char_const*>>::
       assign_to<void(*)(avro::json::TestData<char_const*>const&)>(void(*)(avro::json::TestData<char_const*>const&))
       ::stored_vtable + 1;
  local_e8.m_begin = "&avro::json::testString";
  local_e8.m_end = "";
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::ut_detail::
  param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
  ::param_test_case_generator
            ((param_test_case_generator<avro::json::TestData<const_char_*>,_avro::json::TestData<const_char_*>_*>
              *)&local_d8,(function<void_(avro::json::TestData<const_char_*>)> *)local_118,&local_e8
             ,&local_f8,0xca,(TestData<const_char_*> *)avro::json::stringData,
             (TestData<const_char_*> *)
             boost::debug::anon_unknown_0::prepare_gdb_cmnd_file::cmd_file_name);
  boost::function1<void,_avro::json::TestData<const_char_*>_>::~function1
            ((function1<void,_avro::json::TestData<const_char_*>_> *)local_118);
  boost::unit_test::test_suite::add(this,&local_d8.super_test_unit_generator,0);
  local_d8.super_test_unit_generator._vptr_test_unit_generator = (_func_int **)&PTR_next_001bede0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_tc_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8.m_tc_name._M_dataplus._M_p,
                    local_d8.m_tc_name.field_2._M_allocated_capacity + 1);
  }
  boost::function1<void,_avro::json::TestData<const_char_*>_>::~function1
            ((function1<void,_avro::json::TestData<const_char_*>_> *)&local_d8.m_test_func);
  local_118._8_8_ = avro::json::testArray0;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testArray0";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_00);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xcc,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_118._8_8_ = avro::json::testArray1;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testArray1";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_01);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xcd,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_118._8_8_ = avro::json::testArray2;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testArray2";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_02);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xce,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_118._8_8_ = avro::json::testObject0;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testObject0";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_03);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xd0,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_118._8_8_ = avro::json::testObject1;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testObject1";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_04);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xd1,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  local_118._8_8_ = avro::json::testObject2;
  local_118._0_8_ = boost::function0<void>::assign_to<void(*)()>(void(*)())::stored_vtable + 1;
  pcVar5 = "";
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  ptVar4 = (test_case *)operator_new(0x138);
  local_f8.m_begin = "&avro::json::testObject2";
  local_f8.m_end = "";
  boost::unit_test::ut_detail::normalize_test_case_name_abi_cxx11_
            ((string *)&local_d8,(ut_detail *)&local_f8,name_05);
  local_e8.m_begin = (iterator)local_d8.super_test_unit_generator._vptr_test_unit_generator;
  local_e8.m_end =
       (iterator)
       ((long)local_d8.super_test_unit_generator._vptr_test_unit_generator +
       (long)local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
             super_function_base.vtable);
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_60.m_end = pcVar5;
  boost::unit_test::test_case::test_case
            (ptVar4,&local_e8,&local_60,0xd2,(function<void_()> *)local_118);
  if ((function_buffer *)local_d8.super_test_unit_generator._vptr_test_unit_generator != pfVar2) {
    operator_delete(local_d8.super_test_unit_generator._vptr_test_unit_generator,
                    (ulong)(local_d8.m_test_func.super_function1<void,_avro::json::TestData<bool>_>.
                            super_function_base.functor.members.bound_memfunc_ptr.memfunc_ptr + 1));
  }
  boost::unit_test::test_suite::add(this,(test_unit *)ptVar4,0,0);
  boost::function0<void>::~function0((function0<void> *)local_118);
  return this;
}

Assistant:

boost::unit_test::test_suite*
init_unit_test_suite( int argc, char* argv[] ) 
{
    using namespace boost::unit_test;

    test_suite* ts= BOOST_TEST_SUITE("Avro C++ unit tests for json routines");

    ts->add(BOOST_TEST_CASE(&avro::json::testNull));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testBool,
        avro::json::boolData,
        avro::json::boolData + COUNTOF(avro::json::boolData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testLong,
        avro::json::longData,
        avro::json::longData + COUNTOF(avro::json::longData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testDouble,
        avro::json::doubleData,
        avro::json::doubleData + COUNTOF(avro::json::doubleData)));
    ts->add(BOOST_PARAM_TEST_CASE(&avro::json::testString,
        avro::json::stringData,
        avro::json::stringData + COUNTOF(avro::json::stringData)));

    ts->add(BOOST_TEST_CASE(&avro::json::testArray0));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray1));
    ts->add(BOOST_TEST_CASE(&avro::json::testArray2));

    ts->add(BOOST_TEST_CASE(&avro::json::testObject0));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject1));
    ts->add(BOOST_TEST_CASE(&avro::json::testObject2));

    return ts;
}